

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS ref_agents_create(REF_AGENTS *ref_agents_ptr,REF_MPI ref_mpi)

{
  REF_AGENTS pRVar1;
  REF_AGENT_STRUCT *pRVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  
  pRVar1 = (REF_AGENTS)malloc(0x20);
  *ref_agents_ptr = pRVar1;
  if (pRVar1 == (REF_AGENTS)0x0) {
    pcVar6 = "malloc *ref_agents_ptr of REF_AGENTS_STRUCT NULL";
    uVar4 = 0x24;
  }
  else {
    pRVar1->ref_mpi = ref_mpi;
    pRVar1->n = 0;
    pRVar1->max = 10;
    pRVar2 = (REF_AGENT_STRUCT *)malloc(0x410);
    pRVar1->agent = pRVar2;
    if (pRVar2 != (REF_AGENT_STRUCT *)0x0) {
      lVar3 = 8;
      iVar5 = 1;
      do {
        *(undefined8 *)((long)pRVar2->xyz + lVar3 + -0x38) = 0xffffffff00000000;
        *(int *)((long)pRVar2->xyz + lVar3 + -0x30) = iVar5;
        lVar3 = lVar3 + 0x68;
        iVar5 = iVar5 + 1;
      } while (lVar3 != 0x418);
      pRVar2[9].next = -1;
      pRVar1->blank = 0;
      pRVar1->last = -1;
      return 0;
    }
    pcVar6 = "malloc ref_agents->agent of REF_AGENT_STRUCT NULL";
    uVar4 = 0x2c;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",uVar4,
         "ref_agents_create",pcVar6);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_agents_create(REF_AGENTS *ref_agents_ptr,
                                     REF_MPI ref_mpi) {
  REF_AGENTS ref_agents;
  REF_INT id;

  ref_malloc(*ref_agents_ptr, 1, REF_AGENTS_STRUCT);
  ref_agents = (*ref_agents_ptr);

  ref_agents->ref_mpi = ref_mpi;

  ref_agents->n = 0;
  ref_agents->max = 10;

  ref_malloc(ref_agents->agent, ref_agents->max, REF_AGENT_STRUCT);

  for (id = 0; id < ref_agents->max; id++) {
    ref_agent_mode(ref_agents, id) = REF_AGENT_UNUSED;
    ref_agent_previous(ref_agents, id) = REF_EMPTY;
    ref_agent_next(ref_agents, id) = id + 1;
  }
  ref_agent_next(ref_agents, ref_agents_max(ref_agents) - 1) = REF_EMPTY;
  ref_agents->blank = 0;
  ref_agents->last = REF_EMPTY;

  return REF_SUCCESS;
}